

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

int __thiscall re2::ByteMapBuilder::Recolor(ByteMapBuilder *this,int oldcolor)

{
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __last;
  bool bVar1;
  iterator iVar2;
  pointer ppVar3;
  undefined4 in_ESI;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RDI;
  int newcolor;
  const_iterator it;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar4;
  undefined8 in_stack_ffffffffffffffb8;
  anon_class_4_1_f3fb671a_for__M_pred __pred;
  undefined4 in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_20;
  undefined4 local_14;
  int local_4;
  
  __pred.oldcolor = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_14 = in_ESI;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(in_RDI);
  iVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(in_RDI);
  __last._M_current._4_4_ = local_14;
  __last._M_current._0_4_ = in_stack_ffffffffffffffc0;
  std::
  find_if<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,re2::ByteMapBuilder::Recolor(int)::__0>
            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )iVar2._M_current,__last,__pred);
  __gnu_cxx::
  __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
  ::__normal_iterator<std::pair<int,int>*>
            ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)in_RDI);
  iVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(in_RDI);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)in_RDI);
  if (bVar1) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->(&local_20);
    local_4 = ppVar3->second;
  }
  else {
    iVar4 = *(int *)&in_RDI[0x2c].
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    *(int *)&in_RDI[0x2c].
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start =
         *(int *)&in_RDI[0x2c].
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               CONCAT44(local_14,in_stack_ffffffffffffffc0),&(iVar2._M_current)->first,
               (int *)CONCAT44(iVar4,in_stack_ffffffffffffffb0));
    local_4 = iVar4;
  }
  return local_4;
}

Assistant:

int ByteMapBuilder::Recolor(int oldcolor) {
  // Yes, this is a linear search. There can be at most 256
  // colors and there will typically be far fewer than that.
  // Also, we need to consider keys *and* values in order to
  // avoid recoloring a given range more than once per batch.
  std::vector<std::pair<int, int>>::const_iterator it =
      std::find_if(colormap_.begin(), colormap_.end(),
                   [=](const std::pair<int, int>& kv) -> bool {
                     return kv.first == oldcolor || kv.second == oldcolor;
                   });
  if (it != colormap_.end())
    return it->second;
  int newcolor = nextcolor_;
  nextcolor_++;
  colormap_.emplace_back(oldcolor, newcolor);
  return newcolor;
}